

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O1

void __thiscall FM::OPNA::RhythmMix(OPNA *this,Sample *buffer,uint count)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int i;
  long lVar9;
  Sample *pSVar10;
  int iVar11;
  uint uVar12;
  uint uVar13;
  Rhythm *pRVar14;
  
  iVar3 = this->rhythmtvol;
  if (((iVar3 < 0x80) && (this->rhythm[0].sample != (int16 *)0x0)) &&
     (bVar1 = this->rhythmkey, (bVar1 & 0x3f) != 0)) {
    cVar2 = this->rhythmtl;
    uVar4 = (this->super_OPNABase).rhythmmask_;
    lVar9 = 0;
    do {
      if ((bVar1 >> ((uint)lVar9 & 0x1f) & 1) != 0) {
        pRVar14 = this->rhythm + lVar9;
        iVar11 = (int)pRVar14->level + iVar3 + cVar2 + pRVar14->volume;
        if (iVar11 < -0x1e) {
          iVar11 = -0x1f;
        }
        if (0x7e < iVar11) {
          iVar11 = 0x7f;
        }
        uVar6 = -(pRVar14->pan & 1);
        uVar7 = (int)((uint)pRVar14->pan << 0x1e) >> 0x1f;
        if ((uVar4 & 1 << ((byte)lVar9 & 0x1f)) != 0) {
          uVar6 = 0;
          uVar7 = 0;
        }
        if (count * 2 != 0) {
          iVar11 = (&OPNABase::tltable)[iVar11 + 0x20];
          uVar5 = pRVar14->size;
          uVar12 = pRVar14->pos;
          pSVar10 = buffer;
          do {
            if (uVar5 <= uVar12) break;
            uVar13 = (int)pRVar14->sample[uVar12 >> 10] * (iVar11 >> 4) >> 0xc;
            uVar12 = uVar12 + pRVar14->step;
            pRVar14->pos = uVar12;
            iVar8 = (int)*pSVar10 + (uVar13 & uVar7);
            if (iVar8 < -0x7fff) {
              iVar8 = -0x8000;
            }
            if (0x7ffe < iVar8) {
              iVar8 = 0x7fff;
            }
            *pSVar10 = (short)iVar8;
            iVar8 = (int)pSVar10[1] + (uVar13 & uVar6);
            if (iVar8 < -0x7fff) {
              iVar8 = -0x8000;
            }
            if (0x7ffe < iVar8) {
              iVar8 = 0x7fff;
            }
            pSVar10[1] = (short)iVar8;
            pSVar10 = pSVar10 + 2;
          } while (pSVar10 < buffer + count * 2);
        }
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 6);
  }
  return;
}

Assistant:

void OPNA::RhythmMix(Sample* buffer, uint count)
{
	if (rhythmtvol < 128 && rhythm[0].sample && (rhythmkey & 0x3f))
	{
		Sample* limit = buffer + count * 2;
		for (int i=0; i<6; i++)
		{
			Rhythm& r = rhythm[i];
			if ((rhythmkey & (1 << i)) /*&& r.level < 128*/) // libOPNMIDI: Useless condition, signed int 8t has 127 max
			{
				int db = Limit(rhythmtl+rhythmtvol+r.level+r.volume, 127, -31);
				int vol = tltable[FM_TLPOS+(db << (FM_TLBITS-7))] >> 4;
				int maskl = -((r.pan >> 1) & 1);
				int maskr = -(r.pan & 1);

				if (rhythmmask_ & (1 << i))
				{
					maskl = maskr = 0;
				}

				for (Sample* dest = buffer; dest<limit && r.pos < r.size; dest+=2)
				{
					int sample = (r.sample[r.pos / 1024] * vol) >> 12;
					r.pos += r.step;
					StoreSample(dest[0], sample & maskl);
					StoreSample(dest[1], sample & maskr);
				}
			}
		}
	}
}